

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::TopLevelArray::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430                   \nbuffer Block {                       \n   vec4 a[5][4][3];                  \n};                                   \nout vec4 color;                             \nvoid main() {                               \n    color = vec4(0, 1, 0, 1) + a[0][0][0];  \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 430                   \n"
			   "buffer Block {                       \n"
			   "   vec4 a[5][4][3];                  \n"
			   "};                                   \n"
			   "out vec4 color;                             \n"
			   "void main() {                               \n"
			   "    color = vec4(0, 1, 0, 1) + a[0][0][0];  \n"
			   "}";
	}